

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string * __thiscall
flatbuffers::NumToString<int*>(string *__return_storage_ptr__,flatbuffers *this,int *t)

{
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  flatbuffers *local_18;
  int *t_local;
  
  local_18 = this;
  t_local = (int *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,local_18);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string NumToString(T t) {
  // clang-format off

  #ifndef FLATBUFFERS_PREFER_PRINTF
    std::stringstream ss;
    ss << t;
    return ss.str();
  #else // FLATBUFFERS_PREFER_PRINTF
    auto v = static_cast<long long>(t);
    return NumToStringImplWrapper(v, "%.*lld");
  #endif // FLATBUFFERS_PREFER_PRINTF
  // clang-format on
}